

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_183ce9::allocatePixels
               (int type,Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *uintData,
               Array2D<float_*> *floatData,Array2D<half_*> *halfData,int x1,int x2,int y1,int y2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  sbyte sVar7;
  long lVar8;
  long lVar9;
  half ***ppphVar10;
  long lVar11;
  long local_a8;
  
  lVar5 = (long)y1;
  lVar8 = lVar5 * 4;
  local_a8 = lVar5 * 8;
  do {
    if (y2 < lVar5) {
      return;
    }
    lVar1 = halfData->_sizeY;
    lVar2 = floatData->_sizeY;
    lVar3 = uintData->_sizeY;
    lVar4 = sampleCount->_sizeY;
    for (lVar11 = (long)x1; lVar11 <= x2; lVar11 = lVar11 + 1) {
      sVar7 = 2;
      lVar9 = lVar3;
      ppphVar10 = (half ***)&uintData->_data;
      if (type == 0) {
LAB_0015fe09:
        pvVar6 = operator_new__((ulong)*(uint *)((long)sampleCount->_data +
                                                lVar11 * 4 + lVar4 * lVar8) << sVar7);
        *(void **)((long)*ppphVar10 + lVar11 * 8 + lVar9 * local_a8) = pvVar6;
      }
      else {
        if (type == 2) {
          sVar7 = 1;
          lVar9 = lVar1;
          ppphVar10 = &halfData->_data;
          goto LAB_0015fe09;
        }
        lVar9 = lVar2;
        ppphVar10 = (half ***)&floatData->_data;
        if (type == 1) goto LAB_0015fe09;
      }
    }
    lVar5 = lVar5 + 1;
    lVar8 = lVar8 + 4;
    local_a8 = local_a8 + 8;
  } while( true );
}

Assistant:

void
allocatePixels (int type,
                Array2D<unsigned int>& sampleCount,
                Array2D<unsigned int*>& uintData,
                Array2D<float*>& floatData,
                Array2D<half*>& halfData,
                int x1, int x2, int y1, int y2)
{
    for (int y = y1; y <= y2; y++)
    {
        for (int x = x1; x <= x2; x++)
        {
            if (type == 0)
                uintData[y][x] = new unsigned int[sampleCount[y][x]];
            if (type == 1)
                floatData[y][x] = new float[sampleCount[y][x]];
            if (type == 2)
                halfData[y][x] = new half[sampleCount[y][x]];
        }
    }
}